

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboUtil.cpp
# Opt level: O2

ostream * deqp::gls::FboUtil::operator<<(ostream *stream,ImageFormat *format)

{
  ostream *poVar1;
  Enum<int,_2UL> local_28;
  Enum<int,_2UL> local_18;
  
  if (format->unsizedType == 0) {
    local_28.m_value = format->format;
    local_28.m_getName = glu::getTextureFormatName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_28,stream);
  }
  else {
    poVar1 = std::operator<<(stream,"(format = ");
    local_28.m_value = format->format;
    local_28.m_getName = glu::getTextureFormatName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_28,poVar1);
    poVar1 = std::operator<<(poVar1,", type = ");
    local_18.m_value = format->unsizedType;
    local_18.m_getName = glu::getTypeName;
    poVar1 = tcu::Format::Enum<int,_2UL>::toStream(&local_18,poVar1);
    poVar1 = std::operator<<(poVar1,")");
  }
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& stream, const ImageFormat& format)
{
	if (format.unsizedType == GL_NONE)
	{
		// sized format
		return stream << glu::getTextureFormatStr(format.format);
	}
	else
	{
		// unsized format
		return stream << "(format = " << glu::getTextureFormatStr(format.format) << ", type = " << glu::getTypeStr(format.unsizedType) << ")";
	}
}